

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

_Bool v7m_using_psp(CPUARMState_conflict *env)

{
  _Bool _Var1;
  _Bool local_11;
  CPUARMState_conflict *env_local;
  
  _Var1 = arm_v7m_is_handler_mode(env);
  local_11 = false;
  if (!_Var1) {
    local_11 = ((env->v7m).control[(env->v7m).secure] & 2) != 0;
  }
  return local_11;
}

Assistant:

static inline bool v7m_using_psp(CPUARMState *env)
{
    /* Handler mode always uses the main stack; for thread mode
     * the CONTROL.SPSEL bit determines the answer.
     * Note that in v7M it is not possible to be in Handler mode with
     * CONTROL.SPSEL non-zero, but in v8M it is, so we must check both.
     */
    return !arm_v7m_is_handler_mode(env) &&
        env->v7m.control[env->v7m.secure] & R_V7M_CONTROL_SPSEL_MASK;
}